

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraCommands.cpp
# Opt level: O0

ResponseLine * __thiscall
DebugInfoGenericCommand::trigger(DebugInfoGenericCommand *this,string_view parameters)

{
  bool bVar1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>_>_>
  *this_00;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>_>_>_>
  *this_01;
  undefined1 auVar2 [16];
  size_type local_418;
  char *local_410;
  int local_408;
  size_type local_400;
  char *local_3f8;
  size_type local_3f0;
  const_pointer local_3e8;
  undefined8 local_3e0;
  undefined1 *local_3d0;
  const_pointer local_3c8;
  undefined8 local_3c0;
  size_type local_3b8;
  char *local_3b0;
  size_t local_3a8;
  char *local_3a0;
  char *local_398;
  size_t local_390;
  size_type local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_380;
  int local_374;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_370;
  char local_361;
  User *local_360;
  char local_351;
  char *local_350;
  User *local_348;
  char local_339;
  size_type local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_330;
  char *local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_320;
  size_type local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_310;
  char *local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_300;
  size_type local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f0;
  ResponseLine *local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e0;
  const_pointer local_2d8;
  uint local_2cc;
  size_type local_2c8;
  char *local_2c0;
  size_t local_2b8;
  ResponseLine *local_2b0;
  char *local_2a8;
  size_t local_2a0;
  ResponseLine *local_298;
  undefined8 local_290;
  _If_sv<std::basic_string_view<char>,_basic_string<char>_&> local_288;
  ResponseLine *local_280;
  char *local_278;
  size_t local_270;
  _If_sv<std::basic_string_view<char>,_basic_string<char>_&> local_268;
  ResponseLine *local_260;
  char *local_258;
  size_t local_250;
  ResponseLine *local_248;
  ResponseLine *local_240;
  undefined1 local_231;
  basic_string_view<char,_std::char_traits<char>_> local_230;
  basic_string_view<char,_std::char_traits<char>_> local_220;
  string local_210;
  undefined8 local_1f0;
  User *user;
  value_type *user_pair;
  const_iterator __end2;
  const_iterator __begin2;
  UserTableType *__range2;
  basic_string_view<char,_std::char_traits<char>_> local_1c0;
  basic_string_view<char,_std::char_traits<char>_> local_1b0;
  string local_1a0;
  User *local_180;
  Channel *channel;
  value_type *channel_pair;
  const_iterator __end1;
  const_iterator __begin1;
  ChannelTableType *__range1;
  string local_150;
  undefined1 local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  string local_f8 [32];
  ResponseLine *local_d8;
  ResponseLine *line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  string local_98 [32];
  ResponseLine *local_78;
  ResponseLine *ret;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  long local_50;
  IRC_Bot *server;
  DebugInfoGenericCommand *this_local;
  string_view parameters_local;
  
  parameters_local._M_len = (size_t)parameters._M_str;
  this_local = (DebugInfoGenericCommand *)parameters._M_len;
  server = (IRC_Bot *)this;
  if (IRCCommand::selected_server == 0) {
    if (IRCCommand::active_server == 0) {
      local_248 = (ResponseLine *)operator_new(0x30);
      local_240 = local_248;
      local_60 = sv("Error: No IRC server is currently selected.",0x2b);
      Jupiter::GenericCommand::ResponseLine::ResponseLine
                (local_240,local_60._M_len,local_60._M_str,2);
      return local_248;
    }
    local_50 = IRCCommand::active_server;
  }
  else {
    local_50 = IRCCommand::selected_server;
  }
  local_260 = (ResponseLine *)operator_new(0x30);
  line._7_1_ = 1;
  auVar2 = Jupiter::IRC::Client::getPrefixes();
  local_258 = auVar2._8_8_;
  local_250 = auVar2._0_8_;
  local_a8._M_len = local_250;
  local_a8._M_str = local_258;
  s_abi_cxx11_(&local_c8,"Prefixes: ",10);
  local_268 = std::__cxx11::string::operator+=((string *)&local_c8,&local_a8);
  std::__cxx11::string::string(local_98,local_268);
  Jupiter::GenericCommand::ResponseLine::ResponseLine(local_260,local_98,0);
  line._7_1_ = 0;
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string((string *)&local_c8);
  local_78 = local_260;
  local_280 = (ResponseLine *)operator_new(0x30);
  local_129 = 1;
  auVar2 = Jupiter::IRC::Client::getPrefixModes();
  local_278 = auVar2._8_8_;
  local_270 = auVar2._0_8_;
  local_108._M_len = local_270;
  local_108._M_str = local_278;
  s_abi_cxx11_(&local_128,"Prefix Modes: ",0xe);
  local_288 = std::__cxx11::string::operator+=((string *)&local_128,&local_108);
  std::__cxx11::string::string(local_f8,local_288);
  Jupiter::GenericCommand::ResponseLine::ResponseLine(local_280,local_f8,0);
  local_129 = 0;
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string((string *)&local_128);
  local_d8 = local_280;
  *(ResponseLine **)(local_78 + 0x28) = local_280;
  local_298 = (ResponseLine *)operator_new(0x30);
  local_290 = Jupiter::IRC::Client::getChannelCount();
  string_printf_abi_cxx11_(&local_150,"Outputting data for %u channels...",local_290);
  Jupiter::GenericCommand::ResponseLine::ResponseLine(local_298,&local_150,0);
  *(ResponseLine **)(local_d8 + 0x28) = local_298;
  std::__cxx11::string::~string((string *)&local_150);
  local_d8 = *(ResponseLine **)(local_d8 + 0x28);
  this_00 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>_>_>
             *)Jupiter::IRC::Client::getChannels_abi_cxx11_();
  __end1 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>_>_>
           ::begin(this_00);
  channel_pair = (value_type *)
                 std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>_>_>
                 ::end(this_00);
  while (bVar1 = std::__detail::operator==
                           (&__end1.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>,_false>
                            ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>,_false>
                              *)&channel_pair), ((bVar1 ^ 0xffU) & 1) != 0) {
    channel = (Channel *)
              std::__detail::
              _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>,_false,_false>
              ::operator*(&__end1);
    local_180 = (User *)&((reference)channel)->second;
    local_2b0 = (ResponseLine *)operator_new(0x30);
    auVar2 = Jupiter::IRC::Client::Channel::getName();
    local_2a8 = auVar2._8_8_;
    local_2a0 = auVar2._0_8_;
    local_1b0._M_len = local_2a0;
    local_1b0._M_str = local_2a8;
    local_2c8 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_1b0);
    auVar2 = Jupiter::IRC::Client::Channel::getName();
    local_2c0 = auVar2._8_8_;
    local_2b8 = auVar2._0_8_;
    local_1c0._M_len = local_2b8;
    local_1c0._M_str = local_2c0;
    local_2d8 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_1c0);
    local_2cc = Jupiter::IRC::Client::Channel::getType();
    string_printf_abi_cxx11_
              (&local_1a0,"Channel %.*s - Type: %d",local_2c8,local_2d8,(ulong)local_2cc);
    Jupiter::GenericCommand::ResponseLine::ResponseLine(local_2b0,&local_1a0,0);
    *(ResponseLine **)((long)local_d8 + 0x28) = local_2b0;
    std::__cxx11::string::~string((string *)&local_1a0);
    local_d8 = *(ResponseLine **)((long)local_d8 + 0x28);
    this_01 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>_>_>_>
               *)Jupiter::IRC::Client::Channel::getUsers_abi_cxx11_();
    __end2 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>_>_>_>
             ::begin(this_01);
    user_pair = (value_type *)
                std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>_>_>_>
                ::end(this_01);
    while (bVar1 = std::__detail::operator==
                             (&__end2.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>_>,_false>
                              ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>_>,_false>
                                *)&user_pair), ((bVar1 ^ 0xffU) & 1) != 0) {
      user = (User *)std::__detail::
                     _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>_>,_false,_false>
                     ::operator*(&__end2);
      std::
      __shared_ptr_access<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)((user->m_nickname).field_2._M_local_buf + 8));
      local_1f0 = Jupiter::IRC::Client::Channel::User::getUser();
      local_2e8 = (ResponseLine *)operator_new(0x30);
      local_231 = 1;
      local_2e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  Jupiter::IRC::Client::User::getNickname_abi_cxx11_();
      local_2f8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size(local_2e0);
      local_2f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  Jupiter::IRC::Client::User::getNickname_abi_cxx11_();
      local_308 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  data(local_2f0);
      local_300 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  Jupiter::IRC::Client::User::getUsername_abi_cxx11_();
      local_318 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size(local_300);
      local_310 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  Jupiter::IRC::Client::User::getUsername_abi_cxx11_();
      local_328 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  data(local_310);
      local_320 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  Jupiter::IRC::Client::User::getHostname_abi_cxx11_();
      local_338 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size(local_320);
      local_330 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  Jupiter::IRC::Client::User::getHostname_abi_cxx11_();
      local_350 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  data(local_330);
      local_348 = local_180;
      std::
      __shared_ptr_access<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator*((__shared_ptr_access<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)((user->m_nickname).field_2._M_local_buf + 8));
      local_339 = Jupiter::IRC::Client::Channel::getUserPrefix(local_348);
      if (local_339 == '\0') {
        local_361 = ' ';
      }
      else {
        local_360 = local_180;
        std::
        __shared_ptr_access<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator*((__shared_ptr_access<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)((user->m_nickname).field_2._M_local_buf + 8));
        local_361 = Jupiter::IRC::Client::Channel::getUserPrefix(local_360);
        local_351 = local_361;
      }
      local_374 = (int)local_361;
      std::
      __shared_ptr_access<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)((user->m_nickname).field_2._M_local_buf + 8));
      local_370 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  Jupiter::IRC::Client::Channel::User::getPrefixes_abi_cxx11_();
      local_388 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size(local_370);
      std::
      __shared_ptr_access<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)((user->m_nickname).field_2._M_local_buf + 8));
      local_380 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  Jupiter::IRC::Client::Channel::User::getPrefixes_abi_cxx11_();
      local_3a0 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  data(local_380);
      auVar2 = Jupiter::IRC::Client::Channel::getName();
      local_398 = auVar2._8_8_;
      local_390 = auVar2._0_8_;
      local_220._M_len = local_390;
      local_220._M_str = local_398;
      local_3b8 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_220);
      auVar2 = Jupiter::IRC::Client::Channel::getName();
      local_3b0 = auVar2._8_8_;
      local_3a8 = auVar2._0_8_;
      local_230._M_len = local_3a8;
      local_230._M_str = local_3b0;
      local_3c8 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_230);
      local_3e0 = Jupiter::IRC::Client::User::getChannelCount();
      local_3e8 = local_3c8;
      local_3f0 = local_3b8;
      local_3f8 = local_3a0;
      local_400 = local_388;
      local_408 = local_374;
      local_410 = local_350;
      local_418 = local_338;
      local_3d0 = (undefined1 *)&local_418;
      local_3c0 = local_3e0;
      string_printf_abi_cxx11_
                (&local_210,
                 "User %.*s!%.*s@%.*s (prefix: %c; prefixes: %.*s) of channel %.*s (of %u shared)",
                 local_2f8,local_308,local_318,local_328);
      Jupiter::GenericCommand::ResponseLine::ResponseLine(local_2e8,&local_210,0);
      local_231 = 0;
      *(ResponseLine **)((long)local_d8 + 0x28) = local_2e8;
      std::__cxx11::string::~string((string *)&local_210);
      local_d8 = *(ResponseLine **)((long)local_d8 + 0x28);
      std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>_>,_false,_false>
      ::operator++(&__end2);
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>,_false,_false>
    ::operator++(&__end1);
  }
  return local_78;
}

Assistant:

Jupiter::GenericCommand::ResponseLine *DebugInfoGenericCommand::trigger(std::string_view parameters)
{
	IRC_Bot *server;
	if (IRCCommand::selected_server != nullptr)
		server = IRCCommand::selected_server;
	else if (IRCCommand::active_server != nullptr)
		server = IRCCommand::active_server;
	else
		return new Jupiter::GenericCommand::ResponseLine("Error: No IRC server is currently selected."sv, GenericCommand::DisplayType::PublicError);

	Jupiter::GenericCommand::ResponseLine *ret = new Jupiter::GenericCommand::ResponseLine("Prefixes: "s += server->getPrefixes(), GenericCommand::DisplayType::PublicSuccess);
	Jupiter::GenericCommand::ResponseLine *line = new Jupiter::GenericCommand::ResponseLine("Prefix Modes: "s += server->getPrefixModes(), GenericCommand::DisplayType::PublicSuccess);
	ret->next = line;
	line->next = new Jupiter::GenericCommand::ResponseLine(string_printf("Outputting data for %u channels...", server->getChannelCount()), GenericCommand::DisplayType::PublicSuccess);
	line = line->next;

	for (auto& channel_pair : server->getChannels()) {
		auto& channel = channel_pair.second;
		line->next = new Jupiter::GenericCommand::ResponseLine(string_printf("Channel %.*s - Type: %d", channel.getName().size(),
			channel.getName().data(), channel.getType()), GenericCommand::DisplayType::PublicSuccess);
		line = line->next;

		for (auto& user_pair : channel.getUsers()) {
			Jupiter::IRC::Client::User *user = user_pair.second->getUser();
			line->next = new Jupiter::GenericCommand::ResponseLine(string_printf("User %.*s!%.*s@%.*s (prefix: %c; prefixes: %.*s) of channel %.*s (of %u shared)",
				user->getNickname().size(), user->getNickname().data(),
				user->getUsername().size(), user->getUsername().data(),
				user->getHostname().size(), user->getHostname().data(),
				channel.getUserPrefix(*user_pair.second) ? channel.getUserPrefix(*user_pair.second) : ' ',
				user_pair.second->getPrefixes().size(), user_pair.second->getPrefixes().data(),
				channel.getName().size(), channel.getName().data(),
				user->getChannelCount()), GenericCommand::DisplayType::PublicSuccess);
			line = line->next;
		};
	};

	return ret;
}